

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::enforceOk
          (BasicResult<Catch::Clara::Detail::ParseState> *this)

{
  ResultType RVar1;
  
  RVar1 = (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase.m_type;
  if (RVar1 == Ok) {
    return;
  }
  if (RVar1 != RuntimeError) {
    if (RVar1 == LogicError) {
      __assert_fail("m_type != ResultType::LogicError",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                    ,0x10c1,
                    "virtual void Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::enforceOk() const [T = Catch::Clara::Detail::ParseState]"
                   );
    }
    abort();
  }
  __assert_fail("m_type != ResultType::RuntimeError",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                ,0x10c2,
                "virtual void Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::enforceOk() const [T = Catch::Clara::Detail::ParseState]"
               );
}

Assistant:

void enforceOk() const override {

                    // Errors shouldn't reach this point, but if they do
                    // the actual error message will be in m_errorMessage
                    assert( m_type != ResultType::LogicError );
                    assert( m_type != ResultType::RuntimeError );
                    if ( m_type != ResultType::Ok )
                        std::abort();
                }